

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.c
# Opt level: O0

int mustache_buffer_insert(MUSTACHE_BUFFER *buf,off_t off,void *data,size_t n)

{
  size_t __size;
  void *pvVar1;
  size_t in_RCX;
  void *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  uint8_t *new_data;
  size_t new_alloc;
  
  if ((ulong)in_RDI[2] < in_RDI[1] + in_RCX) {
    __size = (in_RDI[1] + in_RCX) * 2;
    pvVar1 = realloc((void *)*in_RDI,__size);
    if (pvVar1 == (void *)0x0) {
      return -1;
    }
    *in_RDI = (long)pvVar1;
    in_RDI[2] = __size;
  }
  if (in_RSI < (ulong)in_RDI[1]) {
    memmove((void *)(*in_RDI + in_RSI + in_RCX),(void *)(*in_RDI + in_RSI),in_RDI[1] - in_RSI);
  }
  memcpy((void *)(*in_RDI + in_RSI),in_RDX,in_RCX);
  in_RDI[1] = in_RCX + in_RDI[1];
  return 0;
}

Assistant:

static int
mustache_buffer_insert(MUSTACHE_BUFFER* buf, off_t off, const void* data, size_t n)
{
    if(buf->n + n > buf->alloc) {
        size_t new_alloc = (buf->n + n) * 2;
        uint8_t* new_data;

        new_data = (uint8_t*) realloc(buf->data, new_alloc);
        if(new_data == NULL)
            return -1;

        buf->data = new_data;
        buf->alloc = new_alloc;
    }

    if(off < buf->n)
        memmove(buf->data + off + n, buf->data + off, buf->n - off);

    memcpy(buf->data + off, data, n);
    buf->n += n;
    return 0;
}